

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O1

void __thiscall
fmt::v5::
basic_writer<fmt::v5::output_range<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>_>,_wchar_t>_>
::int_writer<wchar_t,_fmt::v5::basic_format_specs<wchar_t>_>::on_num
          (int_writer<wchar_t,_fmt::v5::basic_format_specs<wchar_t>_> *this)

{
  uint uVar1;
  num_writer f;
  uint uVar2;
  wchar_t wVar3;
  uint uVar4;
  int iVar5;
  string_view prefix;
  
  uVar1 = this->abs_value;
  uVar2 = uVar1 | 1;
  uVar4 = 0x1f;
  if (uVar2 != 0) {
    for (; uVar2 >> uVar4 == 0; uVar4 = uVar4 - 1) {
    }
  }
  uVar4 = (uVar4 ^ 0xffffffe0) * 0x4d1 + 0x9ef1 >> 0xc;
  wVar3 = internal::thousands_sep_impl<wchar_t>((locale_ref)(this->writer->locale_).locale_);
  iVar5 = uVar4 - (uVar1 < *(uint *)(internal::basic_data<void>::ZERO_OR_POWERS_OF_10_32 +
                                    (ulong)uVar4 * 4));
  iVar5 = iVar5 + iVar5 / 3 + 1;
  f.size = iVar5;
  f.abs_value = this->abs_value;
  f.sep = wVar3;
  prefix.size_._0_4_ = this->prefix_size;
  prefix.data_ = this->prefix;
  prefix.size_._4_4_ = 0;
  basic_writer<fmt::v5::output_range<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>>,wchar_t>>
  ::
  write_int<fmt::v5::basic_format_specs<wchar_t>,fmt::v5::basic_writer<fmt::v5::output_range<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>>,wchar_t>>::int_writer<wchar_t,fmt::v5::basic_format_specs<wchar_t>>::num_writer>
            ((basic_writer<fmt::v5::output_range<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>>,wchar_t>>
              *)this->writer,iVar5,prefix,this->spec,f);
  return;
}

Assistant:

void on_num() {
      int num_digits = internal::count_digits(abs_value);
      char_type sep = internal::thousands_sep<char_type>(writer.locale_);
      int size = num_digits + SEP_SIZE * ((num_digits - 1) / 3);
      writer.write_int(size, get_prefix(), spec,
                       num_writer{abs_value, size, sep});
    }